

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::addNamePattern(TestSpecParser *this)

{
  ulong uVar1;
  TestSpecParser *in_RDI;
  long in_FS_OFFSET;
  PatternPtr pattern;
  string token;
  shared_ptr<Catch::TestSpec::ExcludedPattern> *in_stack_ffffffffffffff78;
  shared_ptr<Catch::TestSpec::Pattern> *in_stack_ffffffffffffff80;
  vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
  *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  preprocessPattern_abi_cxx11_(in_RDI);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::make_shared<Catch::TestSpec::NamePattern,std::__cxx11::string&,std::__cxx11::string&>
              (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::shared_ptr<Catch::TestSpec::Pattern>::shared_ptr<Catch::TestSpec::NamePattern,void>
              (in_stack_ffffffffffffff80,
               (shared_ptr<Catch::TestSpec::NamePattern> *)in_stack_ffffffffffffff78);
    clara::std::shared_ptr<Catch::TestSpec::NamePattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::NamePattern> *)0x247326);
    if ((in_RDI->m_exclusion & 1U) != 0) {
      std::make_shared<Catch::TestSpec::ExcludedPattern,std::shared_ptr<Catch::TestSpec::Pattern>&>
                ((shared_ptr<Catch::TestSpec::Pattern> *)in_stack_ffffffffffffffa8);
      std::shared_ptr<Catch::TestSpec::Pattern>::operator=
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      clara::std::shared_ptr<Catch::TestSpec::ExcludedPattern>::~shared_ptr
                ((shared_ptr<Catch::TestSpec::ExcludedPattern> *)0x24735b);
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(in_stack_ffffffffffffff90,(value_type *)in_RDI);
    clara::std::shared_ptr<Catch::TestSpec::Pattern>::~shared_ptr
              ((shared_ptr<Catch::TestSpec::Pattern> *)0x2473ac);
  }
  std::__cxx11::string::clear();
  in_RDI->m_exclusion = false;
  in_RDI->m_mode = None;
  std::__cxx11::string::~string(local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestSpecParser::addNamePattern() {
        auto token = preprocessPattern();

        if (!token.empty()) {
            TestSpec::PatternPtr pattern = std::make_shared<TestSpec::NamePattern>(token, m_substring);
            if (m_exclusion)
                pattern = std::make_shared<TestSpec::ExcludedPattern>(pattern);
            m_currentFilter.m_patterns.push_back(pattern);
        }
        m_substring.clear();
        m_exclusion = false;
        m_mode = None;
    }